

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::InitializeFromCommand(cmCTest *this,cmCTestStartCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *__nptr;
  long lVar4;
  string local_280;
  string fname;
  string bld_dir_fname;
  string src_dir_fname;
  string bld_dir;
  ostringstream cmCTestLog_msg;
  string local_68 [32];
  string src_dir;
  
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"SourceDirectory",(allocator *)&bld_dir);
  GetCTestConfiguration(&src_dir,this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"BuildDirectory",(allocator *)&fname);
  GetCTestConfiguration(&bld_dir,this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  for (lVar4 = 0x130; lVar4 != 0x3f0; lVar4 = lVar4 + 0x40) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&this->RepeatTests + lVar4));
  }
  this_00 = (command->super_cmCTestCommand).super_cmCommand.Makefile;
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&src_dir_fname,(string *)&src_dir);
  std::__cxx11::string::append((char *)&src_dir_fname);
  cmsys::SystemTools::ConvertToUnixSlashes(&src_dir_fname);
  std::__cxx11::string::string((string *)&bld_dir_fname,(string *)&bld_dir);
  std::__cxx11::string::append((char *)&bld_dir_fname);
  cmsys::SystemTools::ConvertToUnixSlashes(&bld_dir_fname);
  bVar1 = cmsys::SystemTools::FileExists(bld_dir_fname._M_dataplus._M_p);
  if (bVar1) {
LAB_002dc79c:
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(src_dir_fname._M_dataplus._M_p);
    if (bVar1) goto LAB_002dc79c;
  }
  if (fname._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot locate CTest configuration: in BuildDirectory: ");
    poVar3 = std::operator<<(poVar3,(string *)&bld_dir_fname);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x24c,local_280._M_dataplus._M_p,command->Quiet);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot locate CTest configuration: in SourceDirectory: ");
    poVar3 = std::operator<<(poVar3,(string *)&src_dir_fname);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x250,local_280._M_dataplus._M_p,command->Quiet);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_002dc99a:
    std::__cxx11::string::string
              ((string *)&cmCTestLog_msg,"CTEST_NIGHTLY_START_TIME",(allocator *)&local_280);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"NightlyStartTime",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::string((string *)&cmCTestLog_msg,"CTEST_SITE",(allocator *)&local_280);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"Site",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCTestLog_msg,"CTEST_BUILD_NAME",(allocator *)&local_280);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"BuildName",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCTestLog_msg,"CTEST_DART_SERVER_VERSION",(allocator *)&local_280);
    __nptr = cmMakefile::GetDefinition(this_00,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (__nptr != (char *)0x0) {
      iVar2 = atoi(__nptr);
      this->DartVersion = iVar2;
      if (iVar2 < 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Invalid Dart server version: ");
        poVar3 = std::operator<<(poVar3,__nptr);
        poVar3 = std::operator<<(poVar3,". Please specify the version number.");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x260,local_280._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        goto LAB_002dcc83;
      }
    }
    std::__cxx11::string::string
              ((string *)&cmCTestLog_msg,"CTEST_DROP_SITE_CDASH",(allocator *)&local_280);
    bVar1 = cmMakefile::IsOn(this_00,(string *)&cmCTestLog_msg);
    this->DropSiteCDash = bVar1;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    iVar2 = Initialize(this,bld_dir._M_dataplus._M_p,command);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Use ");
      GetTestModelString_abi_cxx11_(&local_280,this);
      poVar3 = std::operator<<(poVar3,(string *)&local_280);
      poVar3 = std::operator<<(poVar3," tag: ");
      std::__cxx11::string::string(local_68,(string *)&this->CurrentTag);
      poVar3 = std::operator<<(poVar3,local_68);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x26c,local_280._M_dataplus._M_p,command->Quiet);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar1 = true;
      goto LAB_002dcc85;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Reading ctest configuration file: ");
    poVar3 = std::operator<<(poVar3,(string *)&fname);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x240,local_280._M_dataplus._M_p,command->Quiet);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar1 = cmMakefile::ReadDependentFile(this_00,fname._M_dataplus._M_p,true);
    if (bVar1) goto LAB_002dc99a;
    std::__cxx11::string::string
              ((string *)&cmCTestLog_msg,"Could not find include file: ",(allocator *)&local_280);
    std::__cxx11::string::append((string *)&cmCTestLog_msg);
    cmCommand::SetError((cmCommand *)command,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
LAB_002dcc83:
  bVar1 = false;
LAB_002dcc85:
  std::__cxx11::string::~string((string *)&bld_dir_fname);
  std::__cxx11::string::~string((string *)&src_dir_fname);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&bld_dir);
  std::__cxx11::string::~string((string *)&src_dir);
  return bVar1;
}

Assistant:

bool cmCTest::InitializeFromCommand(cmCTestStartCommand* command)
{
  std::string src_dir = this->GetCTestConfiguration("SourceDirectory");
  std::string bld_dir = this->GetCTestConfiguration("BuildDirectory");
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
    this->Parts[p].SubmitFiles.clear();
  }

  cmMakefile* mf = command->GetMakefile();
  std::string fname;

  std::string src_dir_fname = src_dir;
  src_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(src_dir_fname);

  std::string bld_dir_fname = bld_dir;
  bld_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(bld_dir_fname);

  if (cmSystemTools::FileExists(bld_dir_fname.c_str())) {
    fname = bld_dir_fname;
  } else if (cmSystemTools::FileExists(src_dir_fname.c_str())) {
    fname = src_dir_fname;
  }

  if (!fname.empty()) {
    cmCTestOptionalLog(this, OUTPUT, "   Reading ctest configuration file: "
                         << fname << std::endl,
                       command->ShouldBeQuiet());
    bool readit = mf->ReadDependentFile(fname.c_str());
    if (!readit) {
      std::string m = "Could not find include file: ";
      m += fname;
      command->SetError(m);
      return false;
    }
  } else {
    cmCTestOptionalLog(this, WARNING,
                       "Cannot locate CTest configuration: in BuildDirectory: "
                         << bld_dir_fname << std::endl,
                       command->ShouldBeQuiet());
    cmCTestOptionalLog(
      this, WARNING, "Cannot locate CTest configuration: in SourceDirectory: "
        << src_dir_fname << std::endl,
      command->ShouldBeQuiet());
  }

  this->SetCTestConfigurationFromCMakeVariable(mf, "NightlyStartTime",
                                               "CTEST_NIGHTLY_START_TIME",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "Site", "CTEST_SITE",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(
    mf, "BuildName", "CTEST_BUILD_NAME", command->ShouldBeQuiet());
  const char* dartVersion = mf->GetDefinition("CTEST_DART_SERVER_VERSION");
  if (dartVersion) {
    this->DartVersion = atoi(dartVersion);
    if (this->DartVersion < 0) {
      cmCTestLog(this, ERROR_MESSAGE, "Invalid Dart server version: "
                   << dartVersion << ". Please specify the version number."
                   << std::endl);
      return false;
    }
  }
  this->DropSiteCDash = mf->IsOn("CTEST_DROP_SITE_CDASH");

  if (!this->Initialize(bld_dir.c_str(), command)) {
    return false;
  }
  cmCTestOptionalLog(this, OUTPUT, "   Use "
                       << this->GetTestModelString()
                       << " tag: " << this->GetCurrentTag() << std::endl,
                     command->ShouldBeQuiet());
  return true;
}